

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_info.c
# Opt level: O0

size_t ht_system_info_push_system_info_to_listener
                 (HT_TimelineListenerCallback callback,void *listener,HT_Boolean serialize)

{
  size_t sVar1;
  HT_Byte local_88 [8];
  HT_Byte buffer [64];
  HT_SystemInfoEvent event;
  size_t data_size;
  HT_Boolean serialize_local;
  void *listener_local;
  HT_TimelineListenerCallback callback_local;
  
  buffer._56_8_ = ht_HT_SystemInfoEvent_get_event_klass_instance();
  sVar1 = ht_event_utils_serialize_event_to_buffer((HT_Event *)(buffer + 0x38),local_88,serialize);
  (*callback)(local_88,sVar1,serialize,listener);
  return sVar1;
}

Assistant:

size_t
ht_system_info_push_system_info_to_listener(HT_TimelineListenerCallback callback, void* listener, HT_Boolean serialize)
{
    size_t data_size;
    HT_DECL_EVENT(HT_SystemInfoEvent, event);
    event.base.id = event.base.timestamp = 0;
    event.version_major = HT_VERSION_MAJOR;
    event.version_minor = HT_VERSION_MINOR;
    event.version_patch = HT_VERSION_PATCH;

    HT_Byte buffer[64];

    data_size = ht_event_utils_serialize_event_to_buffer(HT_EVENT(&event), buffer, serialize);

    callback(buffer, data_size, serialize, listener);

    return data_size;
}